

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O3

void __thiscall QNetworkRequest::setOriginatingObject(QNetworkRequest *this,QObject *object)

{
  Data *pDVar1;
  Data *pDVar2;
  QNetworkRequestPrivate *pQVar3;
  
  pQVar3 = (this->d).d.ptr;
  if (pQVar3 == (QNetworkRequestPrivate *)0x0) {
    pQVar3 = (QNetworkRequestPrivate *)0x0;
  }
  else if ((__atomic_base<int>)
           *(__int_type *)
            &(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value != (__atomic_base<int>)0x1) {
    QSharedDataPointer<QNetworkRequestPrivate>::detach_helper(&this->d);
    pQVar3 = (this->d).d.ptr;
  }
  if (object == (QObject *)0x0) {
    pDVar2 = (Data *)0x0;
  }
  else {
    pDVar2 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(object);
  }
  pDVar1 = (pQVar3->super_QNetworkHeadersPrivate).originatingObject.wp.d;
  (pQVar3->super_QNetworkHeadersPrivate).originatingObject.wp.d = pDVar2;
  (pQVar3->super_QNetworkHeadersPrivate).originatingObject.wp.value = object;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(pDVar1);
      return;
    }
  }
  return;
}

Assistant:

void QNetworkRequest::setOriginatingObject(QObject *object)
{
    d->originatingObject = object;
}